

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall xmrig::Buffer::move(Buffer *this,Buffer *other)

{
  if ((this->m_size != 0) && (this->m_data != (char *)0x0)) {
    operator_delete__(this->m_data);
  }
  this->m_data = other->m_data;
  this->m_size = other->m_size;
  other->m_data = (char *)0x0;
  other->m_size = 0;
  return;
}

Assistant:

void xmrig::Buffer::move(Buffer &&other)
{
    if (m_size > 0) {
        delete [] m_data;
    }

    m_data = other.m_data;
    m_size = other.m_size;

    other.m_data = nullptr;
    other.m_size = 0;
}